

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTipPartials
          (BeagleCPUImpl<float,_1,_0> *this,int tipIndex,double *inPartials)

{
  void *pvVar1;
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  int k_1;
  int k;
  int i;
  int l;
  float *tmpRealPartialsOffset;
  double *inPartialsOffset;
  int local_40;
  int local_3c;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  BeagleCPUImpl<float,_1,_0> *in_stack_ffffffffffffffd0;
  float *to;
  double *local_28;
  int local_4;
  
  if ((in_ESI < 0) || (*(int *)(in_RDI + 0x10) <= in_ESI)) {
    local_4 = -5;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8) == 0) {
      pvVar1 = mallocAligned(in_stack_ffffffffffffffd0,
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *(void **)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8) = pvVar1;
      if (*(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8) == 0) {
        return -2;
      }
    }
    to = *(float **)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8);
    for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x34); iVar3 = iVar3 + 1) {
      local_28 = in_RDX;
      for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x14); iVar2 = iVar2 + 1) {
        beagleMemCpy<float,double_const>(to,local_28,*(uint *)(in_RDI + 0x24));
        to = to + *(int *)(in_RDI + 0x24);
        for (local_3c = *(int *)(in_RDI + 0x24); local_3c < *(int *)(in_RDI + 0x2c);
            local_3c = local_3c + 1) {
          *to = 0.0;
          to = to + 1;
        }
        local_28 = local_28 + *(int *)(in_RDI + 0x24);
      }
      for (local_40 = 0;
          local_40 < *(int *)(in_RDI + 0x2c) * (*(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x14));
          local_40 = local_40 + 1) {
        *to = 0.0;
        to = to + 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipPartials(int tipIndex,
                                  const double* inPartials) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if(gPartials[tipIndex] == NULL) {
        gPartials[tipIndex] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        // TODO: What if this throws a memory full error?
        if (gPartials[tipIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset;
    REALTYPE* tmpRealPartialsOffset = gPartials[tipIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        inPartialsOffset = inPartials;
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}